

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadIntArray<long>
          (CrateReader *this,bool is_compressed,vector<long,_std::allocator<long>_> *d)

{
  StreamReader *pSVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  void *pvVar5;
  long *plVar6;
  ssize_t sVar7;
  size_type num_ints;
  string local_b78;
  ostringstream local_b58 [8];
  ostringstream ss_e_6;
  size_t sz;
  ostringstream local_9b8 [8];
  ostringstream ss_e_5;
  string local_840;
  ostringstream local_820 [8];
  ostringstream ss_e_4;
  string local_6a8;
  ostringstream local_688 [8];
  ostringstream ss_e_3;
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream ss_e_2;
  ulong local_378;
  uint64_t n_1;
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  uint local_1d4;
  undefined1 local_1d0 [4];
  uint32_t n;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  uint32_t local_34;
  ulong uStack_30;
  uint32_t shapesize;
  size_t length;
  vector<long,_std::allocator<long>_> *d_local;
  CrateReader *pCStack_18;
  bool is_compressed_local;
  CrateReader *this_local;
  
  uStack_30 = 0;
  length = (size_t)d;
  d_local._7_1_ = is_compressed;
  pCStack_18 = this;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar2 = StreamReader::read4(this->_sr,&local_34);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar3 = ::std::operator<<((ostream *)local_1b0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x166);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_1b0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_1d0);
      ::std::__cxx11::string::~string((string *)local_1d0);
      ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
      this_local._7_1_ = 0;
      goto LAB_002560de;
    }
    bVar2 = StreamReader::read4(this->_sr,&local_1d4);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_350);
      poVar3 = ::std::operator<<((ostream *)local_350,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x16b);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_350,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&n_1);
      ::std::__cxx11::string::~string((string *)&n_1);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_350);
      goto LAB_002560de;
    }
    uStack_30 = (ulong)local_1d4;
  }
  else {
    bVar2 = StreamReader::read8(this->_sr,&local_378);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_4f0);
      poVar3 = ::std::operator<<((ostream *)local_4f0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x171);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_4f0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_510);
      ::std::__cxx11::string::~string((string *)&local_510);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
      goto LAB_002560de;
    }
    uStack_30 = local_378;
  }
  if (uStack_30 == 0) {
    ::std::vector<long,_std::allocator<long>_>::clear((vector<long,_std::allocator<long>_> *)length)
    ;
    this_local._7_1_ = 1;
  }
  else if ((this->_config).maxArrayElements < uStack_30) {
    ::std::__cxx11::ostringstream::ostringstream(local_688);
    poVar3 = ::std::operator<<((ostream *)local_688,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x180);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_688,"Too large array elements.");
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_6a8);
    ::std::__cxx11::string::~string((string *)&local_6a8);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_688);
  }
  else {
    this->_memoryUsage = uStack_30 * 8 + this->_memoryUsage;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_820);
      poVar3 = ::std::operator<<((ostream *)local_820,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x183);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_820,"Reached to max memory budget.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_840);
      ::std::__cxx11::string::~string((string *)&local_840);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_820);
    }
    else {
      ::std::vector<long,_std::allocator<long>_>::resize
                ((vector<long,_std::allocator<long>_> *)length,uStack_30);
      if ((d_local._7_1_ & 1) == 0) {
        pSVar1 = this->_sr;
        lVar4 = uStack_30 << 3;
        pvVar5 = (void *)(uStack_30 << 3);
        plVar6 = ::std::vector<long,_std::allocator<long>_>::data
                           ((vector<long,_std::allocator<long>_> *)length);
        sVar7 = StreamReader::read(pSVar1,(int)lVar4,pvVar5,(size_t)plVar6);
        if (sVar7 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_9b8);
          poVar3 = ::std::operator<<((ostream *)local_9b8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x18c);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_9b8,"Failed to read integer array data.");
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&sz);
          ::std::__cxx11::string::~string((string *)&sz);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_9b8);
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else if (uStack_30 < 0x10) {
        pvVar5 = (void *)(uStack_30 << 3);
        pSVar1 = this->_sr;
        plVar6 = ::std::vector<long,_std::allocator<long>_>::data
                           ((vector<long,_std::allocator<long>_> *)length);
        sVar7 = StreamReader::read(pSVar1,(int)pvVar5,pvVar5,(size_t)plVar6);
        if (sVar7 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_b58);
          poVar3 = ::std::operator<<((ostream *)local_b58,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x197);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_b58,
                                     "Failed to read uncompressed integer array data.");
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_b78);
          ::std::__cxx11::string::~string((string *)&local_b78);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_b58);
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else {
        plVar6 = ::std::vector<long,_std::allocator<long>_>::data
                           ((vector<long,_std::allocator<long>_> *)length);
        num_ints = ::std::vector<long,_std::allocator<long>_>::size
                             ((vector<long,_std::allocator<long>_> *)length);
        this_local._7_1_ = ReadCompressedInts<long>(this,plVar6,num_ints);
      }
    }
  }
LAB_002560de:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadIntArray(bool is_compressed, std::vector<T> *d) {

  size_t length{0}; // uncompressed array elements.
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    DCOUT("array.len = " << n);
    length = size_t(n);
  }

  DCOUT("array.len = " << length);
  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too large array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(T) * length);

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(T) * length, sizeof(T) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read integer array data.");
    }

    return true;

  } else {

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(T) * length;
      // Not stored in compressed for smaller data
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressed integer array data.");
      }
      return true;
    }

    return ReadCompressedInts(d->data(), d->size());
  }
}